

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_ec_ctrl_str_256(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  __int32_t *p_Var2;
  int iVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  R3410_ec_params *pRVar6;
  int *piVar7;
  
  iVar3 = strcmp(type,"paramset");
  if (iVar3 != 0) {
    iVar3 = pkey_gost_ec_ctrl_str_common(ctx,type,value);
    return iVar3;
  }
  if (value == (char *)0x0) {
    return 0;
  }
  sVar4 = strlen(value);
  if (sVar4 == 3) {
    pp_Var5 = __ctype_toupper_loc();
    p_Var2 = *pp_Var5;
    if ((p_Var2[(byte)*value] == 0x54) && (p_Var2[(byte)value[1]] == 0x43)) {
      if (3 < p_Var2[(byte)value[2]] - 0x41U) {
        return 0;
      }
      iVar3 = *(int *)(&DAT_00146df0 + (ulong)(p_Var2[(byte)value[2]] - 0x41U) * 4);
      goto LAB_0011506d;
    }
  }
  else if (sVar4 == 2) {
    pp_Var5 = __ctype_toupper_loc();
    if ((*pp_Var5)[(byte)*value] == 0x58) {
      iVar3 = (*pp_Var5)[(byte)value[1]];
      if (iVar3 == 0x41) {
        iVar3 = 0x34b;
      }
      else {
        if (iVar3 != 0x42) {
          return 0;
        }
        iVar3 = 0x34c;
      }
      goto LAB_0011506d;
    }
  }
  else if (sVar4 == 1) {
    pp_Var5 = __ctype_toupper_loc();
    iVar1 = (*pp_Var5)[(byte)*value];
    if (iVar1 < 0x42) {
      if (iVar1 == 0x30) {
        iVar3 = 0x347;
      }
      else {
        iVar3 = 0x348;
        if (iVar1 != 0x41) {
          return 0;
        }
      }
    }
    else if (iVar1 == 0x43) {
      iVar3 = 0x34a;
    }
    else {
      if (iVar1 != 0x42) {
        return 0;
      }
      iVar3 = 0x349;
    }
    goto LAB_0011506d;
  }
  iVar3 = OBJ_txt2nid(value);
  if (iVar3 == 0) {
    return 0;
  }
  pRVar6 = R3410_2001_paramset;
  do {
    iVar1 = pRVar6->nid;
    if (iVar1 == 0) break;
    pRVar6 = pRVar6 + 1;
  } while (iVar1 != iVar3);
  if (iVar1 == 0) {
    ERR_GOST_error(0x7d,0x76,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                   ,0x133);
    return 0;
  }
LAB_0011506d:
  piVar7 = (int *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if (piVar7 != (int *)0x0) {
    *piVar7 = iVar3;
  }
  return (uint)(piVar7 != (int *)0x0);
}

Assistant:

static int pkey_gost_ec_ctrl_str_256(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
    if (strcmp(type, param_ctrl_string) == 0) {
        int param_nid = 0;

        if (!value) {
            return 0;
        }
        if (strlen(value) == 1) {
            switch (toupper((unsigned char)value[0])) {
            case 'A':
                param_nid = NID_id_GostR3410_2001_CryptoPro_A_ParamSet;
                break;
            case 'B':
                param_nid = NID_id_GostR3410_2001_CryptoPro_B_ParamSet;
                break;
            case 'C':
                param_nid = NID_id_GostR3410_2001_CryptoPro_C_ParamSet;
                break;
            case '0':
                param_nid = NID_id_GostR3410_2001_TestParamSet;
                break;
            default:
                return 0;
            }
        } else if ((strlen(value) == 2)
                   && (toupper((unsigned char)value[0]) == 'X')) {
            switch (toupper((unsigned char)value[1])) {
            case 'A':
                param_nid = NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet;
                break;
            case 'B':
                param_nid = NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet;
                break;
            default:
                return 0;
            }
    } else if ((strlen(value) == 3)
        && (toupper((unsigned char)value[0]) == 'T')
        && (toupper((unsigned char)value[1]) == 'C')) {
            switch (toupper((unsigned char)value[2])) {
            case 'A':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetA;
                break;
            case 'B':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetB;
                break;
            case 'C':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetC;
                break;
            case 'D':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetD;
                break;
            default:
                return 0;
            }
        } else {
            R3410_ec_params *p = R3410_2001_paramset;
            param_nid = OBJ_txt2nid(value);
            if (param_nid == NID_undef) {
                return 0;
            }
            for (; p->nid != NID_undef; p++) {
                if (p->nid == param_nid)
                    break;
            }
            if (p->nid == NID_undef) {
                GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_256,
                        GOST_R_INVALID_PARAMSET);
                return 0;
            }
        }

        return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET,
                              param_nid, NULL);
    }

    return pkey_gost_ec_ctrl_str_common(ctx, type, value);
}